

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddIsop.c
# Opt level: O2

DdNode * cuddBddIsop(DdManager *dd,DdNode *L,DdNode *U)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  uint *puVar5;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  DdNode *n_02;
  DdNode *pDVar6;
  DdNode *pDVar7;
  uint *puVar8;
  DdNode *U_00;
  uint index;
  DdNode *pDVar9;
  DdNode *pDVar10;
  
  pDVar6 = dd->one;
  pDVar10 = (DdNode *)((ulong)pDVar6 ^ 1);
  if (pDVar10 == L) {
    return pDVar10;
  }
  if (pDVar6 == U) {
    return pDVar6;
  }
  pDVar4 = cuddCacheLookup2(dd,cuddBddIsop,L,U);
  if (pDVar4 != (DdNode *)0x0) {
    return pDVar4;
  }
  puVar8 = (uint *)((ulong)L & 0xfffffffffffffffe);
  uVar1 = *puVar8;
  iVar2 = dd->perm[uVar1];
  puVar5 = (uint *)((ulong)U & 0xfffffffffffffffe);
  iVar3 = dd->perm[*puVar5];
  pDVar7 = L;
  pDVar4 = L;
  index = *puVar5;
  if (iVar2 <= iVar3) {
    pDVar4 = *(DdNode **)(puVar8 + 4);
    pDVar7 = *(DdNode **)(puVar8 + 6);
    index = uVar1;
    if (((ulong)L & 1) != 0) {
      pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
      pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
    }
  }
  U_00 = U;
  pDVar9 = U;
  if (iVar3 <= iVar2) {
    pDVar9 = *(DdNode **)(puVar5 + 4);
    U_00 = *(DdNode **)(puVar5 + 6);
    if (((ulong)U & 1) != 0) {
      pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
      U_00 = (DdNode *)((ulong)U_00 ^ 1);
    }
  }
  n = cuddBddAndRecur(dd,pDVar7,(DdNode *)((ulong)pDVar9 ^ 1));
  if (n == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  Cudd_Ref(n);
  n_00 = cuddBddAndRecur(dd,pDVar4,(DdNode *)((ulong)U_00 ^ 1));
  if (n_00 == (DdNode *)0x0) goto LAB_00669e3a;
  Cudd_Ref(n_00);
  n_01 = cuddBddIsop(dd,n,U_00);
  if (n_01 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,n);
    n = n_00;
    goto LAB_00669e3a;
  }
  Cudd_Ref(n_01);
  n_02 = cuddBddIsop(dd,n_00,pDVar9);
  if (n_02 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,n);
    Cudd_RecursiveDeref(dd,n_00);
    n = n_01;
    goto LAB_00669e3a;
  }
  Cudd_Ref(n_02);
  Cudd_RecursiveDeref(dd,n);
  Cudd_RecursiveDeref(dd,n_00);
  n = cuddBddAndRecur(dd,pDVar7,(DdNode *)((ulong)n_01 ^ 1));
  if (n == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,n_01);
    n = n_02;
    goto LAB_00669e3a;
  }
  Cudd_Ref(n);
  pDVar4 = cuddBddAndRecur(dd,pDVar4,(DdNode *)((ulong)n_02 ^ 1));
  if (pDVar4 == (DdNode *)0x0) {
LAB_00669fc1:
    Cudd_RecursiveDeref(dd,n_01);
LAB_00669fd6:
    Cudd_RecursiveDeref(dd,n_02);
  }
  else {
    Cudd_Ref(pDVar4);
    pDVar7 = cuddBddAndRecur(dd,(DdNode *)((ulong)n ^ 1),(DdNode *)((ulong)pDVar4 ^ 1));
    if (pDVar7 == (DdNode *)(ulong)(pDVar7 != (DdNode *)0x0)) {
      Cudd_RecursiveDeref(dd,n_01);
      Cudd_RecursiveDeref(dd,n_02);
      Cudd_RecursiveDeref(dd,n);
      n = pDVar4;
      goto LAB_00669e3a;
    }
    pDVar7 = (DdNode *)((ulong)(pDVar7 != (DdNode *)0x0) ^ (ulong)pDVar7);
    Cudd_Ref(pDVar7);
    pDVar9 = cuddBddAndRecur(dd,U_00,pDVar9);
    if (pDVar9 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,n_01);
      Cudd_RecursiveDeref(dd,n_02);
      Cudd_RecursiveDeref(dd,n);
      Cudd_RecursiveDeref(dd,pDVar4);
      n = pDVar7;
      goto LAB_00669e3a;
    }
    Cudd_Ref(pDVar9);
    Cudd_RecursiveDeref(dd,n);
    Cudd_RecursiveDeref(dd,pDVar4);
    pDVar4 = cuddBddIsop(dd,pDVar7,pDVar9);
    if (pDVar4 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,n_01);
      Cudd_RecursiveDeref(dd,n_02);
      Cudd_RecursiveDeref(dd,pDVar7);
      n = pDVar9;
      goto LAB_00669e3a;
    }
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDeref(dd,pDVar7);
    Cudd_RecursiveDeref(dd,pDVar9);
    pDVar6 = cuddUniqueInter(dd,index,pDVar6,pDVar10);
    n = pDVar4;
    if (pDVar6 == (DdNode *)0x0) goto LAB_00669fc1;
    Cudd_Ref(pDVar6);
    pDVar10 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar6 ^ 1),n_01);
    if (pDVar10 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,n_01);
      Cudd_RecursiveDeref(dd,n_02);
    }
    else {
      Cudd_Ref(pDVar10);
      Cudd_RecursiveDeref(dd,n_01);
      n = cuddBddAndRecur(dd,pDVar6,n_02);
      if (n == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,n_02);
        Cudd_RecursiveDeref(dd,pDVar4);
        Cudd_RecursiveDeref(dd,pDVar6);
        n = pDVar10;
        goto LAB_00669e3a;
      }
      Cudd_Ref(n);
      Cudd_RecursiveDeref(dd,pDVar6);
      Cudd_RecursiveDeref(dd,n_02);
      pDVar6 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar10 ^ 1),(DdNode *)((ulong)n ^ 1));
      if (pDVar6 == (DdNode *)(ulong)(pDVar6 != (DdNode *)0x0)) {
        Cudd_RecursiveDeref(dd,pDVar4);
        n_02 = pDVar10;
        goto LAB_00669fd6;
      }
      pDVar6 = (DdNode *)((ulong)(pDVar6 != (DdNode *)0x0) ^ (ulong)pDVar6);
      Cudd_Ref(pDVar6);
      Cudd_RecursiveDeref(dd,pDVar10);
      Cudd_RecursiveDeref(dd,n);
      pDVar10 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar6 ^ 1),(DdNode *)((ulong)pDVar4 ^ 1));
      if (pDVar10 != (DdNode *)(ulong)(pDVar10 != (DdNode *)0x0)) {
        pDVar10 = (DdNode *)((ulong)(pDVar10 != (DdNode *)0x0) ^ (ulong)pDVar10);
        Cudd_Ref(pDVar10);
        Cudd_RecursiveDeref(dd,pDVar6);
        Cudd_RecursiveDeref(dd,pDVar4);
        cuddCacheInsert2(dd,cuddBddIsop,L,U,pDVar10);
        Cudd_Deref(pDVar10);
        return pDVar10;
      }
    }
    Cudd_RecursiveDeref(dd,pDVar4);
    n = pDVar6;
  }
LAB_00669e3a:
  Cudd_RecursiveDeref(dd,n);
  return (DdNode *)0x0;
}

Assistant:

DdNode  *
cuddBddIsop(
  DdManager * dd,
  DdNode * L,
  DdNode * U)
{
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = Cudd_Not(one);
    int         v, top_l, top_u;
    DdNode      *Lsub0, *Usub0, *Lsub1, *Usub1, *Ld, *Ud;
    DdNode      *Lsuper0, *Usuper0, *Lsuper1, *Usuper1;
    DdNode      *Isub0, *Isub1, *Id;
    DdNode      *x;
    DdNode      *term0, *term1, *sum;
    DdNode      *Lv, *Uv, *Lnv, *Unv;
    DdNode      *r;
    int         index;

    statLine(dd);
    if (L == zero)
        return(zero);
    if (U == one)
        return(one);

    /* Check cache */
    r = cuddCacheLookup2(dd, cuddBddIsop, L, U);
    if (r)
        return(r);

    top_l = dd->perm[Cudd_Regular(L)->index];
    top_u = dd->perm[Cudd_Regular(U)->index];
    v = ddMin(top_l, top_u);

    /* Compute cofactors */
    if (top_l == v) {
        index = Cudd_Regular(L)->index;
        Lv = Cudd_T(L);
        Lnv = Cudd_E(L);
        if (Cudd_IsComplement(L)) {
            Lv = Cudd_Not(Lv);
            Lnv = Cudd_Not(Lnv);
        }
    }
    else {
        index = Cudd_Regular(U)->index;
        Lv = Lnv = L;
    }

    if (top_u == v) {
        Uv = Cudd_T(U);
        Unv = Cudd_E(U);
        if (Cudd_IsComplement(U)) {
            Uv = Cudd_Not(Uv);
            Unv = Cudd_Not(Unv);
        }
    }
    else {
        Uv = Unv = U;
    }

    Lsub0 = cuddBddAndRecur(dd, Lnv, Cudd_Not(Uv));
    if (Lsub0 == NULL)
        return(NULL);
    Cudd_Ref(Lsub0);
    Usub0 = Unv;
    Lsub1 = cuddBddAndRecur(dd, Lv, Cudd_Not(Unv));
    if (Lsub1 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        return(NULL);
    }
    Cudd_Ref(Lsub1);
    Usub1 = Uv;

    Isub0 = cuddBddIsop(dd, Lsub0, Usub0);
    if (Isub0 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        Cudd_RecursiveDeref(dd, Lsub1);
        return(NULL);
    }
    Cudd_Ref(Isub0);
    Isub1 = cuddBddIsop(dd, Lsub1, Usub1);
    if (Isub1 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        Cudd_RecursiveDeref(dd, Lsub1);
        Cudd_RecursiveDeref(dd, Isub0);
        return(NULL);
    }
    Cudd_Ref(Isub1);
    Cudd_RecursiveDeref(dd, Lsub0);
    Cudd_RecursiveDeref(dd, Lsub1);

    Lsuper0 = cuddBddAndRecur(dd, Lnv, Cudd_Not(Isub0));
    if (Lsuper0 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        return(NULL);
    }
    Cudd_Ref(Lsuper0);
    Lsuper1 = cuddBddAndRecur(dd, Lv, Cudd_Not(Isub1));
    if (Lsuper1 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        return(NULL);
    }
    Cudd_Ref(Lsuper1);
    Usuper0 = Unv;
    Usuper1 = Uv;

    /* Ld = Lsuper0 + Lsuper1 */
    Ld = cuddBddAndRecur(dd, Cudd_Not(Lsuper0), Cudd_Not(Lsuper1));
    Ld = Cudd_NotCond(Ld, Ld != NULL);
    if (Ld == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        Cudd_RecursiveDeref(dd, Lsuper1);
        return(NULL);
    }
    Cudd_Ref(Ld);
    Ud = cuddBddAndRecur(dd, Usuper0, Usuper1);
    if (Ud == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        Cudd_RecursiveDeref(dd, Lsuper1);
        Cudd_RecursiveDeref(dd, Ld);
        return(NULL);
    }
    Cudd_Ref(Ud);
    Cudd_RecursiveDeref(dd, Lsuper0);
    Cudd_RecursiveDeref(dd, Lsuper1);

    Id = cuddBddIsop(dd, Ld, Ud);
    if (Id == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Ld);
        Cudd_RecursiveDeref(dd, Ud);
        return(NULL);
    }
    Cudd_Ref(Id);
    Cudd_RecursiveDeref(dd, Ld);
    Cudd_RecursiveDeref(dd, Ud);

    x = cuddUniqueInter(dd, index, one, zero);
    if (x == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Id);
        return(NULL);
    }
    Cudd_Ref(x);
    term0 = cuddBddAndRecur(dd, Cudd_Not(x), Isub0);
    if (term0 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, x);
        return(NULL);
    }
    Cudd_Ref(term0);
    Cudd_RecursiveDeref(dd, Isub0);
    term1 = cuddBddAndRecur(dd, x, Isub1);
    if (term1 == NULL) {
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, x);
        Cudd_RecursiveDeref(dd, term0);
        return(NULL);
    }
    Cudd_Ref(term1);
    Cudd_RecursiveDeref(dd, x);
    Cudd_RecursiveDeref(dd, Isub1);
    /* sum = term0 + term1 */
    sum = cuddBddAndRecur(dd, Cudd_Not(term0), Cudd_Not(term1));
    sum = Cudd_NotCond(sum, sum != NULL);
    if (sum == NULL) {
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, term0);
        Cudd_RecursiveDeref(dd, term1);
        return(NULL);
    }
    Cudd_Ref(sum);
    Cudd_RecursiveDeref(dd, term0);
    Cudd_RecursiveDeref(dd, term1);
    /* r = sum + Id */
    r = cuddBddAndRecur(dd, Cudd_Not(sum), Cudd_Not(Id));
    r = Cudd_NotCond(r, r != NULL);
    if (r == NULL) {
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, sum);
        return(NULL);
    }
    Cudd_Ref(r);
    Cudd_RecursiveDeref(dd, sum);
    Cudd_RecursiveDeref(dd, Id);

    cuddCacheInsert2(dd, cuddBddIsop, L, U, r);

    Cudd_Deref(r);
    return(r);

}